

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPSSOR.cpp
# Opt level: O2

double __thiscall chrono::ChSolverPSSOR::Solve(ChSolverPSSOR *this,ChSystemDescriptor *sysd)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  ChConstraint *pCVar5;
  ChVariables *this_00;
  pointer ppCVar6;
  pointer ppCVar7;
  ChConstraint *pCVar8;
  ChConstraint *pCVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  uint ic;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  size_t ic_3;
  long lVar30;
  uint ic_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar34;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 local_138 [16];
  double local_128;
  double old_lambda_friction [3];
  double gi_values [3];
  ChVectorRef local_88;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_70 [24];
  void *local_58;
  ChVectorRef local_48;
  
  this->maxviolation = 0.0;
  ppCVar2 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar25 = (ulong)((long)(sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
    (*(sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar27]->_vptr_ChConstraint[6])();
  }
  ppCVar4 = (sysd->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar24 = 0xffffffff;
  iVar26 = 0;
  for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
    pCVar5 = ppCVar4[uVar27];
    if (pCVar5->mode == CONSTRAINT_FRIC) {
      gi_values[iVar26] = pCVar5->g_i;
      iVar26 = iVar26 + 1;
      if (iVar26 == 3) {
        dVar46 = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
        ppCVar4[uVar24 - 1]->g_i = dVar46;
        ppCVar4[uVar24]->g_i = dVar46;
        iVar26 = 0;
        pCVar5->g_i = dVar46;
      }
    }
    uVar24 = uVar24 + 1;
  }
  for (uVar27 = 0; ((ulong)((long)ppCVar2 - (long)ppCVar3) >> 3 & 0xffffffff) != uVar27;
      uVar27 = uVar27 + 1) {
    this_00 = (sysd->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar27];
    if (this_00->disabled == false) {
      ChVariables::Get_qb(&local_88,this_00);
      ChVariables::Get_fb(&local_48,
                          (sysd->vvariables).
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar27]);
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (local_70,&local_48.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                );
      (*this_00->_vptr_ChVariables[4])(this_00,&local_88,local_70);
      Eigen::internal::handmade_aligned_free(local_58);
    }
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == true) {
    for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
      pCVar5 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar27];
      if (pCVar5->active == true) {
        (*pCVar5->_vptr_ChConstraint[8])(pCVar5->l_i);
      }
    }
  }
  else {
    ppCVar4 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
      ppCVar4[uVar27]->l_i = 0.0;
    }
  }
  uVar24 = 0;
LAB_00d12f01:
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)uVar24) {
    return this->maxviolation;
  }
  this->maxviolation = 0.0;
  auVar45 = ZEXT864(0) << 0x40;
  iVar26 = 0;
  ppCVar4 = (sysd->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_128 = 0.0;
  ppCVar6 = (sysd->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar30 = 0; dVar46 = auVar45._0_8_, (long)ppCVar4 - (long)ppCVar6 >> 3 != lVar30;
      lVar30 = lVar30 + 1) {
    pCVar5 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar30];
    if (pCVar5->active == true) {
      (*pCVar5->_vptr_ChConstraint[7])();
      pCVar5 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar30];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = pCVar5->cfm_i;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = pCVar5->l_i;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar46 + pCVar5->b_i;
      auVar39 = vfmadd132sd_fma(auVar32,auVar47,auVar39);
      auVar32 = auVar39;
      (*pCVar5->_vptr_ChConstraint[0xc])();
      ppCVar7 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar5 = ppCVar7[lVar30];
      auVar31._8_8_ = 0x8000000000000000;
      auVar31._0_8_ = 0x8000000000000000;
      auVar31 = vxorpd_avx512vl(auVar39,auVar31);
      dVar46 = pCVar5->l_i;
      dVar33 = ((this->super_ChIterativeSolverVI).m_omega / pCVar5->g_i) * auVar31._0_8_ + dVar46;
      if (pCVar5->mode == CONSTRAINT_FRIC) {
        old_lambda_friction[iVar26] = dVar46;
        pCVar5->l_i = dVar33;
        if (iVar26 == 0) {
          auVar11._8_8_ = 0x7fffffffffffffff;
          auVar11._0_8_ = 0x7fffffffffffffff;
          auVar31 = vandpd_avx512vl(auVar39,auVar11);
          uVar10 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar39,1);
          auVar50._8_8_ = auVar31._8_8_;
          auVar50._0_8_ = (ulong)!(bool)((byte)uVar10 & 1) * auVar31._0_8_;
          iVar26 = 1;
        }
        else {
          iVar26 = iVar26 + 1;
          auVar50 = ZEXT816(0);
          if (iVar26 == 3) {
            (*ppCVar7[lVar30 + -2]->_vptr_ChConstraint[0xb])();
            ppCVar7 = (sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar46 = (this->super_ChIterativeSolverVI).m_shlambda;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = dVar46;
            pCVar5 = ppCVar7[lVar30 + -2];
            pCVar8 = ppCVar7[lVar30 + -1];
            pCVar9 = ppCVar7[lVar30];
            dVar33 = pCVar5->l_i;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = dVar33;
            dVar34 = pCVar8->l_i;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dVar34;
            local_138._0_8_ = pCVar9->l_i;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = local_138._0_8_;
            if ((dVar46 != 1.0) || (NAN(dVar46))) {
              dVar46 = 1.0 - dVar46;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = dVar46 * old_lambda_friction[0];
              auVar39 = vfmadd213sd_fma(auVar35,auVar67,auVar71);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = dVar46 * old_lambda_friction[1];
              auVar31 = vfmadd213sd_fma(auVar48,auVar67,auVar73);
              dVar34 = auVar31._0_8_;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = dVar46 * old_lambda_friction[2];
              auVar31 = vfmadd213sd_fma(auVar62,auVar67,auVar69);
              dVar33 = auVar39._0_8_;
              pCVar5->l_i = dVar33;
              pCVar8->l_i = dVar34;
              local_138._0_8_ = auVar31._0_8_;
              pCVar9->l_i = (double)local_138._0_8_;
            }
            dVar34 = dVar34 - old_lambda_friction[1];
            dVar33 = dVar33 - old_lambda_friction[0];
            local_138._0_8_ = (double)local_138._0_8_ - old_lambda_friction[2];
            local_138._8_8_ = 0;
            (*pCVar5->_vptr_ChConstraint[8])();
            (*(sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar30 + -1]->_vptr_ChConstraint[8])(dVar34);
            (*(sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar30]->_vptr_ChConstraint[8])
                      (local_138._0_8_);
            iVar26 = 0;
            if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
              auVar20._8_8_ = 0x7fffffffffffffff;
              auVar20._0_8_ = 0x7fffffffffffffff;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_128;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = dVar33;
              auVar39 = vandpd_avx(auVar20,auVar18);
              auVar31 = vmaxsd_avx(auVar49,auVar39);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = dVar34;
              auVar39 = vandpd_avx(auVar20,auVar16);
              auVar31 = vmaxsd_avx(auVar31,auVar39);
              auVar39 = vandpd_avx(auVar20,local_138);
              auVar39 = vmaxsd_avx(auVar31,auVar39);
              local_128 = auVar39._0_8_;
            }
            auVar50 = SUB6416(ZEXT864(0),0) << 0x40;
          }
        }
      }
      else {
        pCVar5->l_i = dVar33;
        (*pCVar5->_vptr_ChConstraint[0xb])();
        dVar33 = (this->super_ChIterativeSolverVI).m_shlambda;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar33;
        pCVar5 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar30];
        dVar34 = pCVar5->l_i;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar34;
        if ((dVar33 != 1.0) || (NAN(dVar33))) {
          auVar63._8_8_ = 0;
          auVar63._0_8_ = dVar46 * (1.0 - dVar33);
          auVar39 = vfmadd213sd_fma(auVar36,auVar51,auVar63);
          dVar34 = auVar39._0_8_;
          pCVar5->l_i = dVar34;
        }
        auVar52._8_8_ = 0x7fffffffffffffff;
        auVar52._0_8_ = 0x7fffffffffffffff;
        auVar50 = vandpd_avx(auVar32,auVar52);
        (*pCVar5->_vptr_ChConstraint[8])();
        if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
          auVar37._8_8_ = 0x7fffffffffffffff;
          auVar37._0_8_ = 0x7fffffffffffffff;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_128;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar34 - dVar46;
          auVar39 = vandpd_avx(auVar37,auVar17);
          auVar39 = vmaxsd_avx(auVar53,auVar39);
          local_128 = auVar39._0_8_;
        }
      }
      auVar38._8_8_ = 0;
      auVar38._0_8_ = this->maxviolation;
      auVar39 = vmaxsd_avx(auVar38,auVar50);
      auVar45 = ZEXT1664(auVar39);
      this->maxviolation = auVar39._0_8_;
    }
  }
  if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
    ChIterativeSolverVI::AtIterationEnd(&this->super_ChIterativeSolverVI,dVar46,local_128,uVar24);
  }
  auVar39 = ZEXT816(0) << 0x40;
  auVar45 = ZEXT864(0) << 0x40;
  iVar26 = 0;
  uVar27 = uVar25;
  do {
    dVar46 = auVar39._0_8_;
    this->maxviolation = dVar46;
    do {
      uVar28 = uVar27;
      uVar27 = uVar28 - 1;
      auVar56._0_8_ = auVar45._0_8_;
      if ((int)(uint)uVar27 < 0) {
        if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
          ChIterativeSolverVI::AtIterationEnd
                    (&this->super_ChIterativeSolverVI,dVar46,auVar56._0_8_,uVar24 | 1);
          dVar46 = this->maxviolation;
        }
        uVar24 = uVar24 + 2;
        if (dVar46 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance) {
          return dVar46;
        }
        goto LAB_00d12f01;
      }
      uVar29 = (uint)uVar27 & 0x7fffffff;
      pCVar5 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar29];
    } while (pCVar5->active != true);
    (*pCVar5->_vptr_ChConstraint[7])();
    pCVar5 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = pCVar5->cfm_i;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pCVar5->l_i;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar46 + pCVar5->b_i;
    auVar39 = vfmadd132sd_fma(auVar40,auVar54,auVar1);
    auVar31 = auVar39;
    (*pCVar5->_vptr_ChConstraint[0xc])();
    pCVar5 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar29];
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    auVar32 = vxorpd_avx512vl(auVar39,auVar12);
    dVar46 = pCVar5->l_i;
    dVar33 = ((this->super_ChIterativeSolverVI).m_omega / pCVar5->g_i) * auVar32._0_8_ + dVar46;
    if (pCVar5->mode == CONSTRAINT_FRIC) {
      auVar66 = SUB6416(ZEXT864(0),0) << 0x40;
      old_lambda_friction[iVar26] = dVar46;
      pCVar5->l_i = dVar33;
      iVar23 = iVar26 + 1;
      if (iVar26 + 1 == 3) {
        (*pCVar5->_vptr_ChConstraint[0xb])();
        ppCVar4 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar46 = (this->super_ChIterativeSolverVI).m_shlambda;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = dVar46;
        pCVar5 = ppCVar4[uVar28];
        pCVar8 = ppCVar4[uVar28 + 1];
        pCVar9 = ppCVar4[uVar29];
        dVar33 = pCVar8->l_i;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar33;
        dVar34 = pCVar5->l_i;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar34;
        dVar61 = pCVar9->l_i;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = dVar61;
        if ((dVar46 != 1.0) || (NAN(dVar46))) {
          dVar46 = 1.0 - dVar46;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = dVar46 * old_lambda_friction[0];
          auVar31 = vfmadd213sd_fma(auVar41,auVar68,auVar72);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = dVar46 * old_lambda_friction[1];
          auVar32 = vfmadd213sd_fma(auVar55,auVar68,auVar74);
          dVar34 = auVar32._0_8_;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = dVar46 * old_lambda_friction[2];
          auVar32 = vfmadd213sd_fma(auVar64,auVar68,auVar70);
          dVar33 = auVar31._0_8_;
          pCVar8->l_i = dVar33;
          pCVar5->l_i = dVar34;
          dVar61 = auVar32._0_8_;
          pCVar9->l_i = dVar61;
        }
        dVar34 = dVar34 - old_lambda_friction[1];
        dVar33 = dVar33 - old_lambda_friction[0];
        dVar61 = dVar61 - old_lambda_friction[2];
        (*pCVar8->_vptr_ChConstraint[8])();
        (*(sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar28]->_vptr_ChConstraint[8])(dVar34);
        (*(sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar29]->_vptr_ChConstraint[8])();
        iVar26 = 0;
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar31 = vandpd_avx512vl(auVar39,auVar13);
        uVar10 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar39,1);
        auVar66._8_8_ = auVar31._8_8_;
        auVar66._0_8_ = (ulong)!(bool)((byte)uVar10 & 1) * auVar31._0_8_;
        iVar23 = 0;
        if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
          auVar21._8_8_ = 0x7fffffffffffffff;
          auVar21._0_8_ = 0x7fffffffffffffff;
          auVar56._8_8_ = 0;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar33;
          auVar39 = vandpd_avx(auVar21,auVar22);
          auVar31 = vmaxsd_avx(auVar56,auVar39);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar34;
          auVar39 = vandpd_avx(auVar21,auVar19);
          auVar31 = vmaxsd_avx(auVar31,auVar39);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = dVar61;
          auVar39 = vandpd_avx(auVar21,auVar14);
          auVar39 = vmaxsd_avx(auVar31,auVar39);
          auVar45 = ZEXT1664(auVar39);
          goto LAB_00d1349b;
        }
      }
      iVar26 = iVar23;
      auVar45 = ZEXT864((ulong)auVar56._0_8_);
    }
    else {
      pCVar5->l_i = dVar33;
      (*pCVar5->_vptr_ChConstraint[0xb])();
      dVar33 = (this->super_ChIterativeSolverVI).m_shlambda;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar33;
      pCVar5 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar29];
      dVar34 = pCVar5->l_i;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar34;
      if ((dVar33 != 1.0) || (NAN(dVar33))) {
        auVar65._8_8_ = 0;
        auVar65._0_8_ = dVar46 * (1.0 - dVar33);
        auVar39 = vfmadd213sd_fma(auVar42,auVar57,auVar65);
        dVar34 = auVar39._0_8_;
        pCVar5->l_i = dVar34;
      }
      auVar58._8_8_ = 0x7fffffffffffffff;
      auVar58._0_8_ = 0x7fffffffffffffff;
      auVar66 = vandpd_avx(auVar58,auVar31);
      (*pCVar5->_vptr_ChConstraint[8])();
      if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
        auVar43._8_8_ = 0x7fffffffffffffff;
        auVar43._0_8_ = 0x7fffffffffffffff;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = auVar56._0_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar34 - dVar46;
        auVar39 = vandpd_avx(auVar43,auVar15);
        auVar60 = vmaxsd_avx(auVar59,auVar39);
      }
      else {
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auVar56._0_8_;
      }
      auVar45 = ZEXT1664(auVar60);
    }
LAB_00d1349b:
    auVar44._8_8_ = 0;
    auVar44._0_8_ = this->maxviolation;
    auVar39 = vmaxsd_avx(auVar44,auVar66);
  } while( true );
}

Assistant:

double ChSolverPSSOR::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    maxviolation = 0;
    double maxdeltalambda = 0.;
    int i_friction_comp = 0;
    double old_lambda_friction[3];
    const unsigned int nConstr = (unsigned int)mconstraints.size();
    const unsigned int nVars = (unsigned int)mvariables.size();

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < nConstr; ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < nConstr; ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:
    for (unsigned int iv = 0; iv < nVars; iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < nConstr; ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < nConstr; ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    for (int iter = 0; iter < m_max_iterations;) {
        //
        // Forward sweep, for symmetric SOR
        //
        maxviolation = 0;
        maxdeltalambda = 0;
        i_friction_comp = 0;
        size_t dummy = mconstraints.size();
        for (size_t ic = 0; ic < dummy; ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;
                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V

                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic - 2]->Increment_q(true_delta_0);
                        mconstraints[ic - 1]->Increment_q(true_delta_1);
                        mconstraints[ic - 0]->Increment_q(true_delta_2);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end constraint loop

        // Terminate the loop if violation in constraints has been successfully limited.
        // if (maxviolation < m_tolerance)
        //	break;

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        // Increment iter count (each sweep, either forward or backward, is considered
        // as a complete iteration, to be fair when comparing to the non-symmetric SOR :)
        iter++;

        //
        // Backward sweep, for symmetric SOR
        //
        maxviolation = 0.;
        maxdeltalambda = 0.;
        i_friction_comp = 0;

        for (int ic = (nConstr - 1); ic >= 0; ic--) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;
                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;
                    if (i_friction_comp == 3) {
                        mconstraints[ic]->Project();  // the N normal component will take care of N,U,V

                        double new_lambda_0 = mconstraints[ic + 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic + 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic + 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic + 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic + 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic + 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic + 2]->Increment_q(true_delta_0);
                        mconstraints[ic + 1]->Increment_q(true_delta_1);
                        mconstraints[ic + 0]->Increment_q(true_delta_2);

                        candidate_violation = fabs(ChMin(0.0, mresidual));

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end loop on constraints

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;

        iter++;
    }

    return maxviolation;
}